

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

uint32_t FastPForLib::asmbits(uint32_t v)

{
  int iVar1;
  uint32_t answer;
  uint32_t v_local;
  undefined4 local_4;
  
  if (v == 0) {
    local_4 = 0;
  }
  else {
    iVar1 = 0x1f;
    if (v != 0) {
      for (; v >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    local_4 = iVar1 + 1;
  }
  return local_4;
}

Assistant:

__attribute__((const)) inline uint32_t asmbits(const uint32_t v) {
#ifdef _MSC_VER
  return gccbits(v);
#elif defined(__aarch64__)
  return gccbits(v);
#else
  if (v == 0)
    return 0;
  uint32_t answer;
  __asm__("bsr %1, %0;" : "=r"(answer) : "r"(v));
  return answer + 1;
#endif
}